

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5MultiIterNew(Fts5Index *p,Fts5Structure *pStruct,int flags,Fts5Colset *pColset,u8 *pTerm,
                     int nTerm,int iLevel,int nSegment,Fts5Iter **ppOut)

{
  int *pRc;
  int *piVar1;
  Fts5StructureLevel *pFVar2;
  int iVar3;
  Fts5Hash *p_00;
  u8 *puVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Fts5Iter *pIter;
  Fts5Data *pFVar9;
  long lVar10;
  ulong uVar11;
  Fts5StructureLevel *pFVar12;
  Fts5StructureSegment *pSeg;
  long lVar13;
  Fts5HashEntry *p_01;
  Fts5SegIter *pFVar14;
  long in_FS_OFFSET;
  u8 *local_58;
  int n;
  u8 *z;
  int nList;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = 0;
  if (p->rc == 0) {
    if (iLevel < 0) {
      uVar11 = (ulong)((uint)((flags & 0x40U) == 0 && p->pHash != (Fts5Hash *)0x0) +
                      pStruct->nSegment);
    }
    else {
      uVar6 = pStruct->aLevel[(uint)iLevel].nSeg;
      if ((int)uVar6 < nSegment) {
        nSegment = uVar6;
      }
      uVar11 = (ulong)(uint)nSegment;
    }
  }
  pIter = fts5MultiIterAlloc(p,(int)uVar11);
  *ppOut = pIter;
  if (pIter != (Fts5Iter *)0x0) {
    pRc = &p->rc;
    pIter->bRev = (uint)flags >> 1 & 1;
    pIter->bSkipEmpty = (byte)flags >> 4 & 1;
    pIter->pColset = pColset;
    if ((flags & 0x20U) == 0) {
      fts5IterSetOutputCb(pRc,pIter);
    }
    if (*pRc == 0) {
      pFVar12 = pStruct->aLevel;
      if (iLevel < 0) {
        iVar3 = pStruct->nLevel;
        p_00 = p->pHash;
        if ((char)((flags & 0x40U) >> 6) == '\0' && p_00 != (Fts5Hash *)0x0) {
          nList = 0;
          z = (u8 *)0x0;
          n = 0;
          if ((flags & 8U) == 0 && pTerm != (u8 *)0x0) {
            uVar6 = fts5HashKey(p_00->nSlot,pTerm,nTerm);
            p_01 = (Fts5HashEntry *)(p_00->aSlot + uVar6);
            do {
              do {
                p_01 = p_01->pHashNext;
                if (p_01 == (Fts5HashEntry *)0x0) {
                  iVar7 = 0;
                  goto LAB_001c874c;
                }
              } while (p_01->nKey != nTerm);
              iVar7 = bcmp(p_01 + 1,pTerm,(long)nTerm);
            } while (iVar7 != 0);
            iVar8 = nTerm + 0x30;
            iVar7 = p_01->nData;
            pFVar9 = (Fts5Data *)sqlite3_malloc64(((long)iVar7 - (long)iVar8) + 0x1a);
            if (pFVar9 == (Fts5Data *)0x0) {
              iVar7 = 7;
LAB_001c874c:
              nList = 0;
              *pRc = iVar7;
              pFVar9 = (Fts5Data *)0x0;
            }
            else {
              iVar7 = iVar7 - iVar8;
              memcpy(pFVar9 + 1,(void *)((long)&p_01->pHashNext + (long)iVar8),(long)iVar7);
              iVar8 = fts5HashAddPoslistSize
                                (p_00,p_01,
                                 (Fts5HashEntry *)((long)&pFVar9->p + (long)(-0x20 - nTerm)));
              nList = iVar7 + iVar8;
              *pRc = 0;
              pFVar9->p = (u8 *)(pFVar9 + 1);
            }
            piVar1 = &pIter->aSeg[0].flags;
            *(byte *)piVar1 = (byte)*piVar1 | 1;
            n = nTerm;
            z = pTerm;
          }
          else {
            local_58 = (u8 *)0x0;
            iVar7 = sqlite3Fts5HashScanInit(p_00,(char *)pTerm,nTerm);
            p->rc = iVar7;
            sqlite3Fts5HashScanEntry(p->pHash,(char **)&z,&n,&local_58,&nList);
            puVar4 = local_58;
            if (local_58 == (u8 *)0x0) {
LAB_001c8775:
              pFVar9 = (Fts5Data *)0x0;
            }
            else {
              pFVar9 = (Fts5Data *)sqlite3Fts5MallocZero(pRc,0x10);
              if (pFVar9 == (Fts5Data *)0x0) goto LAB_001c8775;
              pFVar9->p = puVar4;
            }
            p->bDelete = 0;
          }
          pFVar14 = pIter->aSeg;
          if (pFVar9 != (Fts5Data *)0x0) {
            sqlite3Fts5BufferSet(pRc,&pIter->aSeg[0].term,n,z);
            pFVar9->szLeaf = nList;
            pFVar9->nn = nList;
            pIter->aSeg[0].pLeaf = pFVar9;
            bVar5 = sqlite3Fts5GetVarint(pFVar9->p,(u64 *)&pIter->aSeg[0].iRowid);
            pIter->aSeg[0].iLeafOffset = (ulong)bVar5;
            pIter->aSeg[0].iEndofDoclist = pFVar9->nn;
            if ((flags & 2U) == 0) {
              fts5SegIterLoadNPos(p,pFVar14);
            }
            else {
              piVar1 = &pIter->aSeg[0].flags;
              *(byte *)piVar1 = (byte)*piVar1 | 2;
              fts5SegIterReverseInitPage(p,pFVar14);
            }
          }
          fts5SegIterSetNext(p,pFVar14);
          lVar13 = 1;
        }
        else {
          lVar13 = 0;
        }
        pFVar2 = pFVar12 + iVar3;
        for (; pFVar12 < pFVar2; pFVar12 = pFVar12 + 1) {
          uVar11 = (ulong)(uint)pFVar12->nSeg;
          lVar13 = (long)(int)lVar13;
          pFVar14 = pIter->aSeg + lVar13;
          lVar10 = uVar11 * 0x38;
          while( true ) {
            if ((int)uVar11 < 1) break;
            pSeg = (Fts5StructureSegment *)((long)&pFVar12->aSeg[-1].iSegid + lVar10);
            if (pTerm == (u8 *)0x0) {
              fts5SegIterInit(p,pSeg,pFVar14);
            }
            else {
              fts5SegIterSeekInit(p,pTerm,nTerm,flags,pSeg,pFVar14);
            }
            pFVar14 = pFVar14 + 1;
            uVar11 = (ulong)((int)uVar11 - 1);
            lVar13 = lVar13 + 1;
            lVar10 = lVar10 + -0x38;
          }
        }
      }
      else {
        pFVar14 = pIter->aSeg;
        lVar13 = uVar11 * 0x38;
        while( true ) {
          if ((int)uVar11 < 1) break;
          fts5SegIterInit(p,(Fts5StructureSegment *)
                            ((long)&pFVar12[(uint)iLevel].aSeg[-1].iSegid + lVar13),pFVar14);
          pFVar14 = pFVar14 + 1;
          uVar11 = (ulong)((int)uVar11 - 1);
          lVar13 = lVar13 + -0x38;
        }
      }
      if (*pRc == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          fts5MultiIterFinishSetup(p,pIter);
          return;
        }
        goto LAB_001c8917;
      }
    }
    fts5MultiIterFree(pIter);
    *ppOut = (Fts5Iter *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001c8917:
  __stack_chk_fail();
}

Assistant:

static void fts5MultiIterNew(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  Fts5Structure *pStruct,         /* Structure of specific index */
  int flags,                      /* FTS5INDEX_QUERY_XXX flags */
  Fts5Colset *pColset,            /* Colset to filter on (or NULL) */
  const u8 *pTerm, int nTerm,     /* Term to seek to (or NULL/0) */
  int iLevel,                     /* Level to iterate (-1 for all) */
  int nSegment,                   /* Number of segments to merge (iLevel>=0) */
  Fts5Iter **ppOut                /* New object */
){
  int nSeg = 0;                   /* Number of segment-iters in use */
  int iIter = 0;                  /* */
  int iSeg;                       /* Used to iterate through segments */
  Fts5StructureLevel *pLvl;
  Fts5Iter *pNew;

  assert( (pTerm==0 && nTerm==0) || iLevel<0 );

  /* Allocate space for the new multi-seg-iterator. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      assert( pStruct->nSegment==fts5StructureCountSegments(pStruct) );
      nSeg = pStruct->nSegment;
      nSeg += (p->pHash && 0==(flags & FTS5INDEX_QUERY_SKIPHASH));
    }else{
      nSeg = MIN(pStruct->aLevel[iLevel].nSeg, nSegment);
    }
  }
  *ppOut = pNew = fts5MultiIterAlloc(p, nSeg);
  if( pNew==0 ){
    assert( p->rc!=SQLITE_OK );
    goto fts5MultiIterNew_post_check;
  }
  pNew->bRev = (0!=(flags & FTS5INDEX_QUERY_DESC));
  pNew->bSkipEmpty = (0!=(flags & FTS5INDEX_QUERY_SKIPEMPTY));
  pNew->pColset = pColset;
  if( (flags & FTS5INDEX_QUERY_NOOUTPUT)==0 ){
    fts5IterSetOutputCb(&p->rc, pNew);
  }

  /* Initialize each of the component segment iterators. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      Fts5StructureLevel *pEnd = &pStruct->aLevel[pStruct->nLevel];
      if( p->pHash && 0==(flags & FTS5INDEX_QUERY_SKIPHASH) ){
        /* Add a segment iterator for the current contents of the hash table. */
        Fts5SegIter *pIter = &pNew->aSeg[iIter++];
        fts5SegIterHashInit(p, pTerm, nTerm, flags, pIter);
      }
      for(pLvl=&pStruct->aLevel[0]; pLvl<pEnd; pLvl++){
        for(iSeg=pLvl->nSeg-1; iSeg>=0; iSeg--){
          Fts5StructureSegment *pSeg = &pLvl->aSeg[iSeg];
          Fts5SegIter *pIter = &pNew->aSeg[iIter++];
          if( pTerm==0 ){
            fts5SegIterInit(p, pSeg, pIter);
          }else{
            fts5SegIterSeekInit(p, pTerm, nTerm, flags, pSeg, pIter);
          }
        }
      }
    }else{
      pLvl = &pStruct->aLevel[iLevel];
      for(iSeg=nSeg-1; iSeg>=0; iSeg--){
        fts5SegIterInit(p, &pLvl->aSeg[iSeg], &pNew->aSeg[iIter++]);
      }
    }
    assert( iIter==nSeg );
  }

  /* If the above was successful, each component iterator now points
  ** to the first entry in its segment. In this case initialize the
  ** aFirst[] array. Or, if an error has occurred, free the iterator
  ** object and set the output variable to NULL.  */
  if( p->rc==SQLITE_OK ){
    fts5MultiIterFinishSetup(p, pNew);
  }else{
    fts5MultiIterFree(pNew);
    *ppOut = 0;
  }

fts5MultiIterNew_post_check:
  assert( (*ppOut)!=0 || p->rc!=SQLITE_OK );
  return;
}